

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O1

bool __thiscall
QStringListModel::moveRows
          (QStringListModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  QModelIndex local_68;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < sourceRow) {
    iVar2 = (**(code **)(*(long *)this + 0x78))();
    bVar1 = false;
    if ((destinationChild < 0) || (bVar1 = false, iVar2 < count + sourceRow)) goto LAB_004a0225;
    iVar2 = (**(code **)(*(long *)this + 0x78))(this,destinationParent);
    bVar1 = false;
    if ((sourceRow == destinationChild) || (iVar2 < destinationChild)) goto LAB_004a0225;
    if (((0 < count && destinationChild + -1 != sourceRow) &&
        (((sourceParent->r < 0 || (sourceParent->c < 0)) ||
         ((sourceParent->m).ptr == (QAbstractItemModel *)0x0)))) &&
       (((destinationParent->r < 0 || (destinationParent->c < 0)) ||
        ((destinationParent->m).ptr == (QAbstractItemModel *)0x0)))) {
      local_50.r = -1;
      local_50.c = -1;
      local_50.i = 0;
      local_50.m.ptr = (QAbstractItemModel *)0x0;
      local_68.r = -1;
      local_68.c = -1;
      local_68.i = 0;
      local_68.m.ptr = (QAbstractItemModel *)0x0;
      bVar1 = QAbstractItemModel::beginMoveRows
                        ((QAbstractItemModel *)this,&local_50,sourceRow,count + sourceRow + -1,
                         &local_68,destinationChild);
      if (bVar1) {
        if (count != 0) {
          iVar3 = destinationChild + -1;
          iVar2 = 0;
          if (destinationChild < sourceRow) {
            iVar3 = destinationChild;
            iVar2 = count + -1;
          }
          do {
            QList<QString>::move
                      ((QList<QString> *)(this + 0x10),(ulong)(uint)(iVar2 + sourceRow),(long)iVar3)
            ;
            count = count + -1;
          } while (count != 0);
        }
        QAbstractItemModel::endMoveRows((QAbstractItemModel *)this);
        bVar1 = true;
        goto LAB_004a0225;
      }
    }
  }
  bVar1 = false;
LAB_004a0225:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QStringListModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count, const QModelIndex &destinationParent, int destinationChild)
{
    if (sourceRow < 0
        || sourceRow + count - 1 >= rowCount(sourceParent)
        || destinationChild < 0
        || destinationChild > rowCount(destinationParent)
        || sourceRow == destinationChild
        || sourceRow == destinationChild - 1
        || count <= 0
        || sourceParent.isValid()
        || destinationParent.isValid()) {
        return false;
    }
    if (!beginMoveRows(QModelIndex(), sourceRow, sourceRow + count - 1, QModelIndex(), destinationChild))
        return false;

    int fromRow = sourceRow;
    if (destinationChild < sourceRow)
        fromRow += count - 1;
    else
        destinationChild--;
    while (count--)
        lst.move(fromRow, destinationChild);
    endMoveRows();
    return true;
}